

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall CTxMemPool::removeUnchecked(CTxMemPool *this,txiter it,MemPoolRemovalReason reason)

{
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_00;
  uint64_t mempool_sequence;
  ValidationSignals *this_01;
  undefined8 *puVar1;
  COutPoint *pCVar2;
  pointer psVar3;
  size_t sVar4;
  int32_t iVar5;
  CTxMemPoolEntry **ppCVar6;
  CTxIn *txin;
  COutPoint *key;
  long in_FS_OFFSET;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  mempool_sequence = this->m_sequence_number;
  this->m_sequence_number = mempool_sequence + 1;
  if ((reason != BLOCK) && (this_01 = (this->m_opts).signals, this_01 != (ValidationSignals *)0x0))
  {
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)it.node);
    ValidationSignals::TransactionRemovedFromMempool
              (this_01,(CTransactionRef *)&local_48,reason,mempool_sequence);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  puVar1 = *(undefined8 **)
            &((it.node)->
             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
             ).
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
             .
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
             .
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
             .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
             super_pod_value_holder<CTxMemPoolEntry>.space;
  pCVar2 = (COutPoint *)puVar1[1];
  for (key = (COutPoint *)*puVar1; key != pCVar2; key = (COutPoint *)&key[2].n) {
    indirectmap<COutPoint,_const_CTransaction_*>::erase(&this->mapNextTx,key);
  }
  RemoveUnbroadcastTx(this,(uint256 *)
                           (*(long *)&((it.node)->
                                      super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                      ).
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                      .
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                      .
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                      .
                                      super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                      .super_pod_value_holder<CTxMemPoolEntry>.space + 0x39),true);
  this_00 = &this->txns_randomized;
  psVar3 = (this->txns_randomized).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)psVar3 -
             (long)(this->txns_randomized).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::clear(this_00);
  }
  else {
    sVar4 = *(size_t *)
             ((long)&((it.node)->
                     super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                     ).
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                     .
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                     .
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                     .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                     super_pod_value_holder<CTxMemPoolEntry>.space + 0x100);
    local_48._M_ptr =
         (element_type *)
         GetEntry(this,&(psVar3[-1].
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->hash);
    ppCVar6 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                        ((CTxMemPoolEntry **)&local_48,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
                         ,0x203,"removeUnchecked","GetEntry(txns_randomized.back()->GetHash())");
    (*ppCVar6)->idx_randomized = sVar4;
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->txns_randomized).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(long *)((long)&((it.node)->
                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                  ).
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                  .
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                  .
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                  .
                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                  .super_pod_value_holder<CTxMemPoolEntry>.space + 0x100)].
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
               &(this->txns_randomized).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::pop_back(this_00);
    psVar3 = (this->txns_randomized).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->txns_randomized).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 3) <
        (ulong)((long)(this->txns_randomized).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar3 >> 4)) {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::_M_shrink_to_fit(this_00);
    }
  }
  iVar5 = CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)it.node);
  this->totalTxSize = this->totalTxSize - (long)iVar5;
  this->m_total_fee =
       this->m_total_fee -
       *(long *)((long)&((it.node)->
                        super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                        ).
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                        .
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                        .
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                        .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                        super_pod_value_holder<CTxMemPoolEntry>.space + 0x70);
  this->cachedInnerUsage =
       this->cachedInnerUsage -
       ((*(long *)((long)&((it.node)->
                          super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                          ).
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                          .
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                          .
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                          .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                          super_pod_value_holder<CTxMemPoolEntry>.space + 0x68) +
        *(long *)((long)&((it.node)->
                         super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                         .
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                         .
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                         .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                         super_pod_value_holder<CTxMemPoolEntry>.space + 0x38)) * 0x40 +
       *(long *)((long)&((it.node)->
                        super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                        ).
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                        .
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                        .
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                        .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                        super_pod_value_holder<CTxMemPoolEntry>.space + 0x80));
  boost::multi_index::detail::
  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  ::erase(&(this->mapTx).super_type,(iterator)it.node);
  LOCK();
  (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i =
       (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::removeUnchecked(txiter it, MemPoolRemovalReason reason)
{
    // We increment mempool sequence value no matter removal reason
    // even if not directly reported below.
    uint64_t mempool_sequence = GetAndIncrementSequence();

    if (reason != MemPoolRemovalReason::BLOCK && m_opts.signals) {
        // Notify clients that a transaction has been removed from the mempool
        // for any reason except being included in a block. Clients interested
        // in transactions included in blocks can subscribe to the BlockConnected
        // notification.
        m_opts.signals->TransactionRemovedFromMempool(it->GetSharedTx(), reason, mempool_sequence);
    }
    TRACE5(mempool, removed,
        it->GetTx().GetHash().data(),
        RemovalReasonToString(reason).c_str(),
        it->GetTxSize(),
        it->GetFee(),
        std::chrono::duration_cast<std::chrono::duration<std::uint64_t>>(it->GetTime()).count()
    );

    for (const CTxIn& txin : it->GetTx().vin)
        mapNextTx.erase(txin.prevout);

    RemoveUnbroadcastTx(it->GetTx().GetHash(), true /* add logging because unchecked */);

    if (txns_randomized.size() > 1) {
        // Update idx_randomized of the to-be-moved entry.
        Assert(GetEntry(txns_randomized.back()->GetHash()))->idx_randomized = it->idx_randomized;
        // Remove entry from txns_randomized by replacing it with the back and deleting the back.
        txns_randomized[it->idx_randomized] = std::move(txns_randomized.back());
        txns_randomized.pop_back();
        if (txns_randomized.size() * 2 < txns_randomized.capacity())
            txns_randomized.shrink_to_fit();
    } else
        txns_randomized.clear();

    totalTxSize -= it->GetTxSize();
    m_total_fee -= it->GetFee();
    cachedInnerUsage -= it->DynamicMemoryUsage();
    cachedInnerUsage -= memusage::DynamicUsage(it->GetMemPoolParentsConst()) + memusage::DynamicUsage(it->GetMemPoolChildrenConst());
    mapTx.erase(it);
    nTransactionsUpdated++;
}